

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O2

void init_view(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  viewnum = 0;
  lVar1 = 0x113390;
  for (lVar2 = 0; lVar3 = -0x10, lVar2 != 4; lVar2 = lVar2 + 1) {
    for (; lVar3 != 0; lVar3 = lVar3 + 4) {
      *(undefined4 *)(lVar1 + lVar3) = 0;
      *(undefined4 *)(lVar1 + 0x10 + lVar3) = 0;
    }
    lVar1 = lVar1 + 0x20;
  }
  return;
}

Assistant:

void init_view()
{
   int i, j;

   viewnum = 0;

   for (i=0; i<4; i++) {
      for (j=0; j<4; j++) {
	 viewinfo[i].pos[j] = 0;
	 viewinfo[i].vel[j] = 0;
      }
   }
}